

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleMeshShape.cpp
# Opt level: O2

void __thiscall
cbtTriangleMeshShape::getAabb
          (cbtTriangleMeshShape *this,cbtTransform *trans,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar8 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  cbtVector3 cVar16;
  cbtVector3 cVar17;
  cbtVector3 localCenter;
  cbtMatrix3x3 abs_b;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  cbtVector3 local_80;
  cbtVector3 local_70;
  cbtVector3 local_60;
  cbtVector3 local_50;
  cbtVector3 local_40;
  undefined1 auVar5 [64];
  undefined1 auVar9 [56];
  undefined1 auVar14 [56];
  undefined1 auVar15 [56];
  
  cVar16 = ::operator-(&this->m_localAabbMax,&this->m_localAabbMin);
  fVar1 = cVar16.m_floats[2] * 0.5;
  auVar3._4_8_ = SUB128(ZEXT812(0),4);
  auVar3._0_4_ = fVar1;
  auVar3._12_4_ = 0;
  auVar5 = ZEXT1664(auVar3);
  local_70.m_floats._8_8_ = vmovlps_avx(auVar3);
  (*(this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(this);
  auVar2 = auVar5._0_16_;
  (*(this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(this);
  (*(this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])(this);
  fVar1 = local_a8 + fVar1;
  auVar8 = (undefined1  [56])0x0;
  local_a8 = auVar5._0_4_;
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_a8),0x10);
  local_c8 = cVar16.m_floats[0];
  fStack_c4 = cVar16.m_floats[1];
  fStack_c0 = (float)in_XMM0_Qb;
  fStack_bc = (float)((ulong)in_XMM0_Qb >> 0x20);
  auVar10._0_4_ = auVar2._0_4_ + local_c8 * 0.5;
  auVar10._4_4_ = auVar2._4_4_ + fStack_c4 * 0.5;
  auVar10._8_4_ = auVar2._8_4_ + fStack_c0 * 0.5;
  auVar10._12_4_ = auVar2._12_4_ + fStack_bc * 0.5;
  local_70.m_floats._0_8_ = vmovlps_avx(auVar10);
  local_70.m_floats[2] = fVar1;
  cVar16 = ::operator+(&this->m_localAabbMax,&this->m_localAabbMin);
  auVar5._0_8_ = cVar16.m_floats._0_8_;
  auVar5._8_56_ = auVar8;
  auVar2._8_4_ = 0x3f000000;
  auVar2._0_8_ = 0x3f0000003f000000;
  auVar2._12_4_ = 0x3f000000;
  auVar2 = vmulps_avx512vl(auVar5._0_16_,auVar2);
  auVar14 = (undefined1  [56])0x0;
  local_80.m_floats =
       (cbtScalar  [4])vinsertps_avx(auVar2,ZEXT416((uint)(cVar16.m_floats[2] * 0.5)),0x28);
  auVar9 = ZEXT856(local_80.m_floats._8_8_);
  cbtMatrix3x3::absolute(&trans->m_basis);
  cVar16 = cbtTransform::operator()(trans,&local_80);
  auVar12._0_8_ = cVar16.m_floats._8_8_;
  auVar12._8_56_ = auVar14;
  auVar6._0_8_ = cVar16.m_floats._0_8_;
  auVar6._8_56_ = auVar9;
  auVar8 = auVar9;
  auVar15 = auVar14;
  cVar17 = cbtVector3::dot3(&local_70,&local_60,&local_50,&local_40);
  auVar13._0_8_ = cVar17.m_floats._8_8_;
  auVar13._8_56_ = auVar15;
  auVar7._0_8_ = cVar17.m_floats._0_8_;
  auVar7._8_56_ = auVar8;
  auVar2 = vsubps_avx(auVar6._0_16_,auVar7._0_16_);
  auVar3 = vsubps_avx(auVar12._0_16_,auVar13._0_16_);
  auVar4._0_4_ = cVar16.m_floats[0] + cVar17.m_floats[0];
  auVar4._4_4_ = cVar16.m_floats[1] + cVar17.m_floats[1];
  auVar4._8_4_ = auVar9._0_4_ + auVar8._0_4_;
  auVar4._12_4_ = auVar9._4_4_ + auVar8._4_4_;
  auVar11._0_4_ = cVar16.m_floats[2] + cVar17.m_floats[2];
  auVar11._4_4_ = cVar16.m_floats[3] + cVar17.m_floats[3];
  auVar11._8_4_ = auVar14._0_4_ + auVar15._0_4_;
  auVar11._12_4_ = auVar14._4_4_ + auVar15._4_4_;
  auVar2 = vinsertps_avx(auVar2,auVar3,0x28);
  auVar3 = vinsertps_avx(auVar4,auVar11,0x28);
  *(undefined1 (*) [16])aabbMin->m_floats = auVar2;
  *(undefined1 (*) [16])aabbMax->m_floats = auVar3;
  return;
}

Assistant:

void cbtTriangleMeshShape::getAabb(const cbtTransform& trans, cbtVector3& aabbMin, cbtVector3& aabbMax) const
{
	cbtVector3 localHalfExtents = cbtScalar(0.5) * (m_localAabbMax - m_localAabbMin);
	localHalfExtents += cbtVector3(getMargin(), getMargin(), getMargin());
	cbtVector3 localCenter = cbtScalar(0.5) * (m_localAabbMax + m_localAabbMin);

	cbtMatrix3x3 abs_b = trans.getBasis().absolute();

	cbtVector3 center = trans(localCenter);

	cbtVector3 extent = localHalfExtents.dot3(abs_b[0], abs_b[1], abs_b[2]);
	aabbMin = center - extent;
	aabbMax = center + extent;
}